

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SharedDirectory.cpp
# Opt level: O2

bool __thiscall SharedDirectory::can_create_file(SharedDirectory *this,uint64_t size,string *name)

{
  char cVar1;
  bool bVar2;
  iterator iVar3;
  path pStack_58;
  string local_38;
  
  if ((size - 1 < this->remaining_space) &&
     (cVar1 = boost::filesystem::portable_name((string *)name), cVar1 != '\0')) {
    std::__cxx11::string::string((string *)&local_38,(string *)name);
    path_in_dir(&pStack_58,this,&local_38);
    bVar2 = boost::filesystem::exists(&pStack_58);
    if ((bVar2) ||
       (iVar3 = std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                        *)this,name),
       (_Rb_tree_header *)iVar3._M_node != &(this->indexed_files)._M_t._M_impl.super__Rb_tree_header
       )) {
      bVar2 = false;
    }
    else {
      iVar3 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
              ::find(&(this->pending_files)._M_t,name);
      bVar2 = (_Rb_tree_header *)iVar3._M_node ==
              &(this->pending_files)._M_t._M_impl.super__Rb_tree_header;
    }
    std::__cxx11::string::~string((string *)&pStack_58);
    std::__cxx11::string::~string((string *)&local_38);
    return bVar2;
  }
  return false;
}

Assistant:

bool SharedDirectory::can_create_file(uint64_t size, const std::string &name) {
  return size <= this->remaining_space && size > 0
      && portable_name(name)
      && !exists(path_in_dir(name))
      && (indexed_files.find(name) == indexed_files.end())
      && (pending_files.find(name) == pending_files.end());
}